

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O0

EVsource old_EVcreate_submit_handle(CManager cm,EVstone stone,CMFormatList format_list)

{
  int iVar1;
  CManager_conflict cm_00;
  EVsource p_Var2;
  long in_RDX;
  int i;
  int count;
  FMStructDescList structs;
  uint7 in_stack_ffffffffffffffd0;
  undefined1 uVar3;
  int local_28;
  int stone_00;
  
  stone_00 = 0;
  while( true ) {
    uVar3 = false;
    if (in_RDX != 0) {
      uVar3 = *(long *)(in_RDX + (long)stone_00 * 0x10) != 0;
    }
    if ((bool)uVar3 == false) break;
    stone_00 = stone_00 + 1;
  }
  cm_00 = (CManager_conflict)INT_CMmalloc((ulong)in_stack_ffffffffffffffd0);
  for (local_28 = 0; local_28 < stone_00; local_28 = local_28 + 1) {
    (&cm_00->transports)[(long)local_28 * 4] =
         *(transport_entry_conflict **)(in_RDX + (long)local_28 * 0x10);
    *(undefined8 *)(&cm_00->initialized + (long)local_28 * 8) =
         *(undefined8 *)(in_RDX + (long)local_28 * 0x10 + 8);
    iVar1 = struct_size_field_list((FMFieldList)cm_00,stone_00);
    *(int *)(&cm_00->control_module_choice + (long)local_28 * 4) = iVar1;
    *(undefined8 *)(&cm_00->CManager_ID + (long)local_28 * 8) = 0;
  }
  (&cm_00->transports)[(long)stone_00 * 4] = (transport_entry_conflict *)0x0;
  *(undefined8 *)(&cm_00->initialized + (long)stone_00 * 8) = 0;
  p_Var2 = EVcreate_submit_handle
                     (cm_00,stone_00,(FMStructDescList)CONCAT17(uVar3,in_stack_ffffffffffffffd0));
  return p_Var2;
}

Assistant:

extern EVsource
old_EVcreate_submit_handle(CManager cm, EVstone stone, CMFormatList format_list)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVcreate_submit_handle(cm, stone, structs);
}